

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double extract_spR<PredictionData<float,unsigned_long>,unsigned_long>
                 (PredictionData<float,_unsigned_long> *prediction_data,unsigned_long *row_st,
                 unsigned_long *row_end,size_t col_num)

{
  unsigned_long *puVar1;
  unsigned_long *in_RCX;
  unsigned_long *in_RDX;
  unsigned_long *in_RSI;
  long in_RDI;
  unsigned_long *search_res;
  unsigned_long *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if (in_RDX == in_RSI) {
    local_8 = 0.0;
  }
  else {
    puVar1 = std::lower_bound<unsigned_long_const*,unsigned_long>
                       (in_RDX,in_RCX,in_stack_ffffffffffffffd0);
    if ((puVar1 == in_RDX) || ((unsigned_long *)*puVar1 != in_RCX)) {
      local_8 = 0.0;
    }
    else {
      local_8 = (double)*(float *)(*(long *)(in_RDI + 0x48) +
                                  ((long)puVar1 - *(long *)(in_RDI + 0x50) >> 3) * 4);
    }
  }
  return local_8;
}

Assistant:

double extract_spR(const PredictionData &prediction_data, const sparse_ix *row_st, const sparse_ix *row_end, size_t col_num) noexcept
{
    if (row_end == row_st)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}